

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

void * utf8casestr(void *haystack,void *needle)

{
  char *pcVar1;
  char b;
  char a;
  char *n;
  char *maybeMatch;
  char *h;
  void *needle_local;
  void *haystack_local;
  void *local_8;
  
  h = (char *)haystack;
  local_8 = haystack;
  if (*needle != '\0') {
    while (pcVar1 = h, n = (char *)needle, *h != '\0') {
      while( true ) {
        a = *h;
        b = *n;
        if (('@' < a) && (a < '[')) {
          a = a | 0x20;
        }
        if (('@' < b) && (b < '[')) {
          b = b | 0x20;
        }
        if (a != b) break;
        n = n + 1;
        h = h + 1;
      }
      if (*n == '\0') {
        return pcVar1;
      }
      if (*h != '\0') {
        do {
          h = h + 1;
        } while (((int)*h & 0xc0U) == 0x80);
      }
    }
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void *utf8casestr(const void *haystack, const void *needle) {
  const char *h = (const char *)haystack;

  // if needle has no utf8 codepoints before the null terminating
  // byte then return haystack
  if ('\0' == *((const char *)needle)) {
    return (void *)haystack;
  }

  while ('\0' != *h) {
    const char *maybeMatch = h;
    const char *n = (const char *)needle;

    for (;;) {
      char a = *h;
      char b = *n;
      // not entirely correct, but good enough
      if (('A' <= a) && ('Z' >= a)) {
        a |= 0x20; // make a lowercase
      }

      if (('A' <= b) && ('Z' >= b)) {
        b |= 0x20; // make b lowercase
      }

      // if we find a mismatch, bail out!
      if (a != b) {
        break;
      }

      n++;
      h++;
    }

    if ('\0' == *n) {
      // we found the whole utf8 string for needle in haystack at
      // maybeMatch, so return it
      return (void *)maybeMatch;
    } else {
      // h could be in the middle of an unmatching utf8 codepoint,
      // so we need to march it on to the next character beginning,
      if ('\0' != *h) {
        do {
          h++;
        } while (0x80 == (0xc0 & *h));
      }
    }
  }

  // no match
  return 0;
}